

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Init(sqlite3 *db,char **pzErrMsg)

{
  uint uVar1;
  Schema *pSVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  uVar1 = db->mDbFlags;
  pSVar2 = db->aDb->pSchema;
  db->enc = pSVar2->enc;
  if (((pSVar2->schemaFlags & 1) == 0) && (iVar3 = sqlite3InitOne(db,0,pzErrMsg,0), iVar3 != 0)) {
    return iVar3;
  }
  iVar3 = db->nDb;
  uVar5 = (ulong)(iVar3 - 1) << 5 | 0x18;
  while( true ) {
    if (iVar3 < 2) {
      if ((uVar1 & 1) == 0) {
        *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xfe;
      }
      return 0;
    }
    iVar3 = iVar3 + -1;
    if (((*(byte *)(*(long *)((long)&db->aDb->zDbSName + uVar5) + 0x72) & 1) == 0) &&
       (iVar4 = sqlite3InitOne(db,iVar3,pzErrMsg,0), iVar4 != 0)) break;
    uVar5 = uVar5 - 0x20;
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3Init(sqlite3 *db, char **pzErrMsg){
  int i, rc;
  int commit_internal = !(db->mDbFlags&DBFLAG_SchemaChange);
  
  assert( sqlite3_mutex_held(db->mutex) );
  assert( sqlite3BtreeHoldsMutex(db->aDb[0].pBt) );
  assert( db->init.busy==0 );
  ENC(db) = SCHEMA_ENC(db);
  assert( db->nDb>0 );
  /* Do the main schema first */
  if( !DbHasProperty(db, 0, DB_SchemaLoaded) ){
    rc = sqlite3InitOne(db, 0, pzErrMsg, 0);
    if( rc ) return rc;
  }
  /* All other schemas after the main schema. The "temp" schema must be last */
  for(i=db->nDb-1; i>0; i--){
    assert( i==1 || sqlite3BtreeHoldsMutex(db->aDb[i].pBt) );
    if( !DbHasProperty(db, i, DB_SchemaLoaded) ){
      rc = sqlite3InitOne(db, i, pzErrMsg, 0);
      if( rc ) return rc;
    }
  }
  if( commit_internal ){
    sqlite3CommitInternalChanges(db);
  }
  return SQLITE_OK;
}